

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

void initValue(Storage3D *ref,ElementType val,int64_t domain_size,int64_t domain_heigh)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int64_t iVar7;
  int64_t k;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  iVar7 = halo_width;
  auVar6 = _DAT_001030f0;
  auVar5 = _DAT_001030e0;
  lVar8 = -halo_width;
  lVar10 = domain_size + halo_width;
  if (lVar10 != lVar8 && SBORROW8(lVar10,lVar8) == lVar10 + halo_width < 0) {
    lVar1 = domain_height + halo_width;
    lVar2 = domain_height + halo_width * 2;
    lVar11 = domain_height + halo_width * 2 + -1;
    auVar19._8_4_ = (int)lVar11;
    auVar19._0_8_ = lVar11;
    auVar19._12_4_ = (int)((ulong)lVar11 >> 0x20);
    lVar11 = halo_width * 8;
    lVar14 = halo_width * -8;
    lVar12 = 1 - halo_width;
    auVar19 = auVar19 ^ _DAT_001030f0;
    lVar9 = lVar8;
    do {
      lVar3 = (ref->strides)._M_elems[1];
      lVar4 = (ref->strides)._M_elems[0];
      lVar17 = (ref->strides)._M_elems[2] * lVar14;
      lVar16 = -(lVar4 * 8 + lVar3 * 8) * iVar7 + lVar17 + ref->offset * 8 + (long)ref->alignedPtr;
      lVar18 = ((ref->offset * 8 + lVar12 * 8 * lVar4 + lVar17) - lVar11 * lVar3) +
               (long)ref->alignedPtr;
      lVar17 = lVar8;
      do {
        if (lVar1 != lVar8 && SBORROW8(lVar1,lVar8) == lVar1 + iVar7 < 0) {
          lVar13 = 0;
          uVar15 = 0;
          do {
            auVar20._8_4_ = (int)uVar15;
            auVar20._0_8_ = uVar15;
            auVar20._12_4_ = (int)(uVar15 >> 0x20);
            auVar20 = (auVar20 | auVar5) ^ auVar6;
            if ((bool)(~(auVar19._4_4_ < auVar20._4_4_ ||
                        auVar19._0_4_ < auVar20._0_4_ && auVar20._4_4_ == auVar19._4_4_) & 1)) {
              *(undefined8 *)(lVar16 + lVar13) = 0;
            }
            if (auVar20._12_4_ <= auVar19._12_4_ &&
                (auVar20._8_4_ <= auVar19._8_4_ || auVar20._12_4_ != auVar19._12_4_)) {
              *(undefined8 *)(lVar18 + lVar13) = 0;
            }
            uVar15 = uVar15 + 2;
            lVar13 = lVar13 + lVar4 * 0x10;
          } while ((lVar2 + 1U & 0xfffffffffffffffe) != uVar15);
        }
        lVar17 = lVar17 + 1;
        lVar16 = lVar16 + lVar3 * 8;
        lVar18 = lVar18 + lVar3 * 8;
      } while (lVar17 != lVar10);
      lVar9 = lVar9 + 1;
      lVar14 = lVar14 + 8;
    } while (lVar9 != lVar10);
  }
  return;
}

Assistant:

void initValue(Storage3D &ref, const ElementType val, const int64_t domain_size, const int64_t domain_heigh) {
  for (int64_t i = -halo_width; i < domain_size + halo_width; ++i)
    for (int64_t j = -halo_width; j < domain_size + halo_width; ++j)
      for (int64_t k = -halo_width; k < domain_height + halo_width; ++k) {
        ref(i, j, k) = val;
      }
}